

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O2

UBool __thiscall
icu_63::Normalizer2Impl::hasCompBoundaryBefore(Normalizer2Impl *this,uint8_t *src,uint8_t *limit)

{
  byte *pbVar1;
  UCPTrie *trie;
  UBool UVar2;
  uint uVar3;
  uint uVar4;
  byte t3;
  byte bVar5;
  
  if (src == limit) {
    return '\x01';
  }
  bVar5 = *src;
  uVar4 = (uint)bVar5;
  if ((char)bVar5 < '\0') {
    pbVar1 = src + 1;
    if (pbVar1 != limit) {
      if (bVar5 < 0xe0) {
        if ((0xc1 < bVar5) && ((byte)(*pbVar1 ^ 0x80) < 0x40)) {
          uVar4 = (uint)this->normTrie->index[bVar5 & 0x1f] + (*pbVar1 ^ 0x80);
          goto LAB_0028c15e;
        }
      }
      else if (bVar5 < 0xf0) {
        uVar3 = bVar5 & 0xf;
        if (((((byte)" 000000000000\x1000"[uVar3] >> (*pbVar1 >> 5) & 1) != 0) && (src + 2 != limit)
            ) && (uVar4 = src[2] ^ 0x80, (byte)uVar4 < 0x40)) {
          uVar4 = *(ushort *)
                   ((long)this->normTrie->index + (ulong)(uVar3 * 0x80 + (*pbVar1 & 0x3f) * 2)) +
                  uVar4;
          goto LAB_0028c15e;
        }
      }
      else if (bVar5 < 0xf5) {
        if ((((((uint)(int)""[*pbVar1 >> 4] >> (uVar4 - 0xf0 & 0x1f) & 1) != 0) &&
             (src + 2 != limit)) && (bVar5 = src[2] + 0x80, bVar5 < 0x40)) &&
           ((src + 3 != limit && (t3 = src[3] + 0x80, t3 < 0x40)))) {
          uVar4 = *pbVar1 & 0x3f | (uVar4 - 0xf0) * 0x40;
          trie = this->normTrie;
          if (uVar4 < trie->shifted12HighStart) {
            uVar4 = ucptrie_internalSmallU8Index_63(trie,uVar4,bVar5,t3);
          }
          else {
            uVar4 = trie->dataLength - 2;
          }
          goto LAB_0028c15e;
        }
      }
    }
    uVar4 = this->normTrie->dataLength - 1;
  }
LAB_0028c15e:
  UVar2 = norm16HasCompBoundaryBefore
                    (this,*(uint16_t *)((long)(this->normTrie->data).ptr0 + (long)(int)uVar4 * 2));
  return UVar2;
}

Assistant:

UBool Normalizer2Impl::hasCompBoundaryBefore(const uint8_t *src, const uint8_t *limit) const {
    if (src == limit) {
        return TRUE;
    }
    uint16_t norm16;
    UCPTRIE_FAST_U8_NEXT(normTrie, UCPTRIE_16, src, limit, norm16);
    return norm16HasCompBoundaryBefore(norm16);
}